

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLoad.cpp
# Opt level: O2

void __thiscall chrono::ChLoadCustom::CreateJacobianMatrices(ChLoadCustom *this)

{
  ChLoadJacobians *pCVar1;
  vector<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_> mvars;
  undefined1 local_38 [16];
  pointer local_28;
  _Vector_base<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_> local_20;
  
  if ((this->super_ChLoadBase).jacobians == (ChLoadJacobians *)0x0) {
    pCVar1 = (ChLoadJacobians *)::operator_new(0x80);
    (pCVar1->KRM).super_ChKblock._vptr_ChKblock = (_func_int **)&PTR__ChKblockGeneric_01186748;
    (pCVar1->KRM).K.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.
    m_data = (double *)0x0;
    (pCVar1->KRM).K.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.
    m_rows = 0;
    (pCVar1->KRM).K.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.
    m_cols = 0;
    (pCVar1->KRM).variables.
    super__Vector_base<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (pCVar1->KRM).variables.
    super__Vector_base<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (pCVar1->KRM).variables.
    super__Vector_base<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    (pCVar1->K).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.m_data =
         (double *)0x0;
    (pCVar1->K).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.m_rows =
         0;
    (pCVar1->K).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.m_rows =
         0;
    (pCVar1->K).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.m_cols =
         0;
    (pCVar1->R).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.m_data =
         (double *)0x0;
    (pCVar1->R).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.m_rows =
         0;
    (pCVar1->R).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.m_cols =
         0;
    (pCVar1->M).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.m_data =
         (double *)0x0;
    (pCVar1->M).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.m_rows =
         0;
    (pCVar1->M).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.m_cols =
         0;
    local_38 = ZEXT416(0) << 0x40;
    (this->super_ChLoadBase).jacobians = pCVar1;
    local_28 = (pointer)0x0;
    (*((this->loadable).super___shared_ptr<chrono::ChLoadable,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
      _vptr_ChLoadable[0xc])();
    pCVar1 = (this->super_ChLoadBase).jacobians;
    std::vector<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>::vector
              ((vector<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_> *)&local_20,
               (vector<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_> *)local_38);
    ChLoadJacobians::SetVariables
              (pCVar1,(vector<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_> *)
                      &local_20);
    std::_Vector_base<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>::~_Vector_base
              (&local_20);
    std::_Vector_base<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>::~_Vector_base
              ((_Vector_base<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_> *)
               local_38);
  }
  return;
}

Assistant:

void ChLoadCustom::CreateJacobianMatrices() {
    if (!jacobians) {
        // create jacobian structure
        jacobians = new ChLoadJacobians;
        // set variables forsparse KRM block
        std::vector<ChVariables*> mvars;
        loadable->LoadableGetVariables(mvars);
        jacobians->SetVariables(mvars);
    }
}